

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# composition.cc
# Opt level: O0

bool tinyusdz::anon_unknown_160::IsUSDFileFormat(string *name)

{
  int iVar1;
  bool local_31;
  undefined1 local_30 [8];
  string ext;
  string *name_local;
  
  ext.field_2._8_8_ = name;
  GetExtension((string *)local_30,name);
  iVar1 = ::std::__cxx11::string::compare(local_30);
  local_31 = true;
  if (iVar1 != 0) {
    iVar1 = ::std::__cxx11::string::compare(local_30);
    local_31 = true;
    if (iVar1 != 0) {
      iVar1 = ::std::__cxx11::string::compare(local_30);
      local_31 = iVar1 == 0;
    }
  }
  ::std::__cxx11::string::~string((string *)local_30);
  return local_31;
}

Assistant:

bool IsUSDFileFormat(const std::string &name) {
  std::string ext = GetExtension(name);

  // no 'usdz'
  return (ext.compare("usd") == 0) || (ext.compare("usda") == 0) ||
         (ext.compare("usdc") == 0);
}